

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyUtil.c
# Opt level: O2

void Ivy_ManCollectCut_rec(Ivy_Man_t *p,Ivy_Obj_t *pNode,Vec_Int_t *vNodes)

{
  uint uVar1;
  
  uVar1 = *(uint *)&pNode->field_0x8;
  if ((uVar1 & 0x10) != 0) {
    return;
  }
  *(uint *)&pNode->field_0x8 = uVar1 | 0x10;
  if ((uVar1 & 0xf) - 5 < 2) {
    Ivy_ManCollectCut_rec(p,(Ivy_Obj_t *)((ulong)pNode->pFanin0 & 0xfffffffffffffffe),vNodes);
    Ivy_ManCollectCut_rec(p,(Ivy_Obj_t *)((ulong)pNode->pFanin1 & 0xfffffffffffffffe),vNodes);
    Vec_IntPush(vNodes,pNode->Id);
    return;
  }
  __assert_fail("Ivy_ObjIsAnd(pNode) || Ivy_ObjIsExor(pNode)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyUtil.c"
                ,0x58,"void Ivy_ManCollectCut_rec(Ivy_Man_t *, Ivy_Obj_t *, Vec_Int_t *)");
}

Assistant:

void Ivy_ManCollectCut_rec( Ivy_Man_t * p, Ivy_Obj_t * pNode, Vec_Int_t * vNodes )
{
    if ( pNode->fMarkA )
        return;
    pNode->fMarkA = 1;
    assert( Ivy_ObjIsAnd(pNode) || Ivy_ObjIsExor(pNode) );
    Ivy_ManCollectCut_rec( p, Ivy_ObjFanin0(pNode), vNodes );
    Ivy_ManCollectCut_rec( p, Ivy_ObjFanin1(pNode), vNodes );
    Vec_IntPush( vNodes, pNode->Id );
}